

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

Vec3f * __thiscall Model::point(Model *this,int i)

{
  pointer pVVar1;
  
  if (-1 < i) {
    pVVar1 = (this->verts).super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (i < (int)(((long)(this->verts).
                         super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pVVar1) / 0xc)) {
      return pVVar1 + (uint)i;
    }
  }
  __assert_fail("i>=0 && i<nverts()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Reynault[P]RDV_Projet_Sies_Romary/src/model.cpp"
                ,0x4d,"Vec3f &Model::point(int)");
}

Assistant:

Vec3f &Model::point(int i) {
    assert(i>=0 && i<nverts());
    return verts[i];
}